

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall JetHead::Socket::getRemoteAddress(Socket *this,Address *addr)

{
  socklen_t sVar1;
  int iVar2;
  socklen_t sock_len;
  sockaddr_in sock_addr;
  socklen_t local_50;
  sockaddr local_4c;
  sa_family_t local_3c;
  in_port_t local_3a;
  in_addr_t local_38;
  
  local_50 = 0x10;
  iVar2 = getpeername(this->mFd,&local_4c,&local_50);
  sVar1 = local_50;
  if (iVar2 == 0) {
    memcpy(&local_3c,&local_4c,(long)(int)local_50);
    (addr->mAddr).sin_family = local_3c;
    (addr->mAddr).sin_addr.s_addr = local_38;
    (addr->mAddr).sin_port = local_3a;
    addr->mLen = sVar1;
  }
  else {
    (addr->mAddr).sin_family = 2;
    (addr->mAddr).sin_port = 0;
    (addr->mAddr).sin_addr = 0;
    addr->mLen = 0x10;
    if (this->mSockStream != false) {
      return iVar2;
    }
    (addr->mAddr).sin_family = (this->mLastDatagramSender).mAddr.sin_family;
    (addr->mAddr).sin_addr.s_addr = (this->mLastDatagramSender).mAddr.sin_addr.s_addr;
    (addr->mAddr).sin_port = (this->mLastDatagramSender).mAddr.sin_port;
    addr->mLen = (this->mLastDatagramSender).mLen;
  }
  return 0;
}

Assistant:

int Socket::getRemoteAddress( Socket::Address &addr )
{
	struct sockaddr_in sock_addr;
	socklen_t sock_len = sizeof( sock_addr );
	
	int res = getpeername( mFd, (struct sockaddr*)&sock_addr, &sock_len );
	
	if ( res == 0 )
	{
		addr = Socket::Address( &sock_addr, sock_len );
	}
	else
	{
		addr = Socket::Address();
		if (not mSockStream)
		{
			addr = mLastDatagramSender;
			return 0;
		}
	}
	
	return res;
}